

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::EncodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  string *psVar5;
  mapped_type *pmVar6;
  size_t start;
  char c;
  string encoded;
  char local_79;
  string *local_78;
  string local_70;
  string local_50;
  
  if (s->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    paVar1 = &local_70.field_2;
    start = 0;
    local_78 = __return_storage_ptr__;
    do {
      local_79 = (s->_M_dataplus)._M_p[start];
      pmVar6 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->encodings_table_,&local_79);
      pcVar2 = (pmVar6->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + pmVar6->_M_string_length);
      if (local_70._M_string_length != 0) {
        pcVar2 = (s->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + s->_M_string_length);
        psVar5 = local_78;
        EncodeRemaining(local_78,this,&local_50,start,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar1) {
          return psVar5;
        }
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return psVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      start = start + 1;
      uVar3 = s->_M_string_length;
    } while (start < uVar3);
    (local_78->_M_dataplus)._M_p = (pointer)&local_78->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    paVar1 = &s->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
      (local_78->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_78->field_2 + 8) = uVar4;
    }
    else {
      (local_78->_M_dataplus)._M_p = pcVar2;
      (local_78->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_78->_M_string_length = uVar3;
    (s->_M_dataplus)._M_p = (pointer)paVar1;
    s->_M_string_length = 0;
    (s->field_2)._M_local_buf[0] = '\0';
    __return_storage_ptr__ = local_78;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::EncodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    for (size_t i = 0; i < s.length(); i++)
    {
        char c = s.at(i);
        std::string encoded = c < 255 ? encodings_table_[c] : CharacterEntity(c);
        if (!encoded.empty())
        {
            return EncodeRemaining(s, i, encoded);
        }
    }

    return s;
}